

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int GetLatestMTMessageMT(MT *pMT,int addr,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  int addr_00;
  uchar *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  size_t __n;
  double dVar5;
  long lStack_18c0;
  int Bytes;
  int local_18ac;
  uchar *ptr;
  int local_189c;
  int local_1898;
  int len;
  uint *local_1890;
  uchar *local_1888;
  CHRONO chrono;
  uchar savebuf [2048];
  uchar recvbuf [4096];
  
  Bytes = 0;
  ptr = (uchar *)0x0;
  len = 0;
  local_1898 = databuflen;
  local_1890 = (uint *)pNbdatabytes;
  StartChrono(&chrono);
  memset(recvbuf,0,0x1000);
  memset(savebuf,0,0x800);
  iVar1 = ReadRS232Port(&pMT->RS232Port,recvbuf,0x7ff,&Bytes);
  if (iVar1 == 0) {
    iVar1 = Bytes;
    local_18ac = mid;
    local_189c = addr;
    local_1888 = databuf;
    if (Bytes < 0x7ff) {
LAB_00181a4e:
      addr_00 = local_189c;
      while (iVar2 = FindLatestMTMessage(recvbuf,iVar1,addr_00,local_18ac,&ptr,&len),
            __dest = local_1888, iVar3 = local_1898, iVar2 != 0) {
        dVar5 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar5) {
LAB_00181ad0:
          puts("Error reading data from a MT : Message timeout. ");
          return 2;
        }
        if (0xffe < iVar1) {
          puts("Error reading data from a MT : Invalid data. ");
          return 4;
        }
        iVar3 = ReadRS232Port(&pMT->RS232Port,recvbuf + iVar1,0xfff - iVar1,&Bytes);
        if (iVar3 != 0) goto LAB_00181966;
        iVar1 = iVar1 + Bytes;
      }
      memset(local_1888,0,(long)local_1898);
      uVar4 = (uint)ptr[3];
      if (ptr[3] == 0xff) {
        uVar4 = (uint)(ushort)(*(ushort *)(ptr + 4) << 8 | *(ushort *)(ptr + 4) >> 8);
        lStack_18c0 = 6;
      }
      else {
        lStack_18c0 = 4;
      }
      ptr = ptr + lStack_18c0;
      *local_1890 = uVar4;
      if ((int)uVar4 <= iVar3) {
        if (uVar4 == 0) {
          return 0;
        }
        memcpy(__dest,ptr,(ulong)uVar4);
        return 0;
      }
      __s = "Too small data buffer.";
      goto LAB_0018196d;
    }
    do {
      iVar1 = Bytes;
      if (Bytes != 0x7ff) {
        __n = (size_t)Bytes;
        memmove(recvbuf + (0x7ff - __n),recvbuf,__n);
        memcpy(recvbuf,savebuf + __n,(long)(0x7ff - iVar1));
        iVar1 = 0x7ff;
        goto LAB_00181a4e;
      }
      dVar5 = GetTimeElapsedChronoQuick(&chrono);
      if (4.0 < dVar5) goto LAB_00181ad0;
      memcpy(savebuf,recvbuf,(long)Bytes);
      iVar1 = ReadRS232Port(&pMT->RS232Port,recvbuf,0x7ff,&Bytes);
    } while (iVar1 == 0);
  }
LAB_00181966:
  __s = "Error reading data from a MT. ";
LAB_0018196d:
  puts(__s);
  return 1;
}

Assistant:

inline int GetLatestMTMessageMT(MT* pMT, int addr, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[2*MAX_NB_BYTES_MT];
	unsigned char savebuf[MAX_NB_BYTES_MT];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MT-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MT. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
			{
				printf("Error reading data from a MT : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MT. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestMTMessage(recvbuf, BytesReceived, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
		{
			printf("Error reading data from a MT : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MT-1)
		{
			printf("Error reading data from a MT : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MT-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MT. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	ptr = GetDataBytesMTMessage(ptr, pNbdatabytes);
	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}
	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}